

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O1

double __thiscall gmath::OrthoCamera::projectPoint(OrthoCamera *this,Vector2d *p,Vector3d *Pw)

{
  int i_1;
  long lVar1;
  Matrix33d *pMVar2;
  undefined8 *puVar3;
  int k_1;
  int k;
  Matrix33d *pMVar4;
  int i;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dStack_88;
  Vector3d Pc;
  double dStack_68;
  SVector<double,_3> ret;
  undefined8 local_48 [9];
  
  local_48[6] = 0;
  local_48[7] = 0;
  local_48[4] = 0;
  local_48[5] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[8] = 0;
  lVar1 = 0;
  auVar7 = _DAT_00153490;
  do {
    if (SUB164(auVar7 ^ _DAT_001534a0,4) == -0x80000000 &&
        SUB164(auVar7 ^ _DAT_001534a0,0) < -0x7ffffffd) {
      *(undefined8 *)((long)local_48 + lVar1) = 0x3ff0000000000000;
      *(undefined8 *)((long)local_48 + lVar1 + 0x20) = 0x3ff0000000000000;
    }
    lVar5 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 2;
    auVar7._8_8_ = lVar5 + 2;
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0x80);
  pMVar2 = &(this->super_Camera).R;
  puVar3 = local_48;
  lVar1 = 0;
  do {
    lVar5 = 0;
    pMVar4 = pMVar2;
    do {
      puVar3[lVar5] = pMVar4->v[0][0];
      lVar5 = lVar5 + 1;
      pMVar4 = (Matrix33d *)(pMVar4->v + 1);
    } while (lVar5 != 3);
    lVar1 = lVar1 + 1;
    puVar3 = puVar3 + 3;
    pMVar2 = (Matrix33d *)(pMVar2->v[0] + 1);
  } while (lVar1 != 3);
  ret.v[1] = 0.0;
  lVar1 = 0;
  do {
    ret.v[lVar1 + -1] = Pw->v[lVar1] - (this->super_Camera).T.v[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  Pc.v[1] = 0.0;
  puVar3 = local_48;
  lVar1 = 0;
  do {
    dVar6 = Pc.v[lVar1 + -1];
    lVar5 = 0;
    do {
      dVar6 = dVar6 + (double)puVar3[lVar5] * ret.v[lVar5 + -1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    Pc.v[lVar1 + -1] = dVar6;
    lVar1 = lVar1 + 1;
    puVar3 = puVar3 + 3;
  } while (lVar1 != 3);
  *(double *)p = 0.0 / this->res;
  *(double *)(p + 8) = -0.0 / this->res;
  return Pc.v[1] / this->dres;
}

Assistant:

double OrthoCamera::projectPoint(Vector2d &p, const Vector3d &Pw) const
{
  Vector3d Pc=transpose(getR())*(Pw-getT());

  p[0]=Pc[0]/res;
  p[1]=-Pc[1]/res;

  return Pc[2]/dres;
}